

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O3

int __thiscall QtMWidgets::ToolBarLayout::spaceNeeded(ToolBarLayout *this)

{
  QArrayData *pQVar1;
  QLayoutItem **ppQVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  
  pQVar1 = &((this->buttons).d.d)->super_QArrayData;
  ppQVar2 = (this->buttons).d.ptr;
  lVar3 = (this->buttons).d.size;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (lVar3 == 0) {
    iVar9 = 0;
    iVar8 = 0;
  }
  else {
    lVar7 = 0;
    iVar8 = 0;
    iVar9 = 0;
    do {
      uVar6 = (**(code **)(**(long **)((long)ppQVar2 + lVar7) + 0x10))();
      iVar4 = (**(code **)(*(long *)this + 0x60))(this);
      iVar5 = (**(code **)(*(long *)this + 0x60))(this);
      iVar9 = iVar9 + (int)uVar6 + iVar4;
      iVar8 = iVar8 + (int)((ulong)uVar6 >> 0x20) + iVar5;
      lVar7 = lVar7 + 8;
    } while (lVar3 << 3 != lVar7);
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,8,8);
    }
  }
  if (this->orient == Horizontal) {
    iVar8 = iVar9;
  }
  return iVar8;
}

Assistant:

int
ToolBarLayout::spaceNeeded() const
{
	QSize size( 0, 0 );

	foreach( QLayoutItem * item, buttons )
	{
		size += item->sizeHint();
		size += QSize( spacing(), spacing() );
	}

	if( orient == Qt::Horizontal )
		return size.width();
	else
		return size.height();
}